

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O3

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize,
                       int bmi2)

{
  uint uVar1;
  short sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  undefined4 uVar12;
  ushort uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  bVar7 = (byte)tableLog;
  uVar15 = 1 << (bVar7 & 0x1f);
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d5,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d6,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < 0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x1d7,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  uVar1 = uVar15 - 1;
  uVar5 = (uint)(0x8000 << (bVar7 & 0x1f)) >> 0x10;
  uVar12 = 1;
  uVar16 = 0;
  uVar9 = (ulong)uVar1;
  do {
    uVar13 = normalizedCounter[uVar16];
    if (uVar13 == 0xffff) {
      dt[uVar9 + 1].baseValue = (U32)uVar16;
      uVar13 = 1;
      uVar9 = (ulong)((int)uVar9 - 1);
    }
    else {
      if ((short)uVar13 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x1e5,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      if (uVar5 < uVar13 || uVar5 == uVar13) {
        uVar12 = 0;
      }
    }
    *(ushort *)((long)wksp + uVar16 * 2) = uVar13;
    uVar16 = uVar16 + 1;
  } while (maxSymbolValue + 1 != uVar16);
  dt->nextState = (short)uVar12;
  dt->nbAdditionalBits = (char)((uint)uVar12 >> 0x10);
  dt->nbBits = (char)((uint)uVar12 >> 0x18);
  dt->baseValue = tableLog;
  auVar4 = _DAT_008ff720;
  auVar3 = _DAT_008ff710;
  if ((uint)uVar9 == uVar1) {
    iVar6 = (uVar15 >> 1) + (uVar15 >> 3) + 3;
    lVar17 = 0;
    lVar10 = 0;
    uVar9 = 0;
    do {
      uVar13 = normalizedCounter[uVar9];
      *(long *)((long)wksp + lVar17 + 0x6a) = lVar10;
      if (8 < (long)(short)uVar13) {
        uVar11 = 0x10;
        if (0x10 < uVar13) {
          uVar11 = uVar13;
        }
        uVar16 = (ulong)uVar11 - 9;
        auVar21._8_4_ = (int)uVar16;
        auVar21._0_8_ = uVar16;
        auVar21._12_4_ = (int)(uVar16 >> 0x20);
        auVar19._0_8_ = uVar16 >> 3;
        auVar19._8_8_ = auVar21._8_8_ >> 3;
        auVar19 = auVar19 ^ auVar4;
        uVar14 = 0;
        do {
          auVar20._8_4_ = (int)uVar14;
          auVar20._0_8_ = uVar14;
          auVar20._12_4_ = (int)(uVar14 >> 0x20);
          auVar21 = (auVar20 | auVar3) ^ auVar4;
          if ((bool)(~(auVar19._4_4_ < auVar21._4_4_ ||
                      auVar19._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar19._4_4_) & 1)) {
            *(long *)((long)wksp + uVar14 * 8 + lVar17 + 0x72) = lVar10;
          }
          if (auVar21._12_4_ <= auVar19._12_4_ &&
              (auVar21._8_4_ <= auVar19._8_4_ || auVar21._12_4_ != auVar19._12_4_)) {
            *(long *)((long)wksp + uVar14 * 8 + lVar17 + 0x7a) = lVar10;
          }
          uVar14 = uVar14 + 2;
        } while (((uVar16 >> 3) + 2 & 0xfffffffffffffffe) != uVar14);
      }
      if ((short)uVar13 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x207,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      lVar17 = lVar17 + (short)uVar13;
      lVar10 = lVar10 + 0x101010101010101;
      bVar18 = uVar9 != maxSymbolValue;
      uVar9 = uVar9 + 1;
    } while (bVar18);
    if ((uVar15 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x215,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    uVar9 = 0;
    uVar5 = 0;
    do {
      dt[(ulong)(uVar5 & uVar1) + 1].baseValue = (uint)*(byte *)((long)wksp + uVar9 + 0x6a);
      dt[(ulong)(uVar5 + iVar6 & uVar1) + 1].baseValue = (uint)*(byte *)((long)wksp + uVar9 + 0x6b);
      uVar5 = uVar5 + iVar6 * 2 & uVar1;
      uVar9 = uVar9 + 2;
    } while (uVar9 < uVar15);
    if (uVar5 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x21e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    uVar16 = 0;
    uVar5 = 0;
    do {
      sVar2 = normalizedCounter[uVar16];
      if (0 < sVar2) {
        iVar6 = 0;
        do {
          dt[(ulong)uVar5 + 1].baseValue = (U32)uVar16;
          do {
            uVar5 = uVar5 + (uVar15 >> 1) + (uVar15 >> 3) + 3 & uVar1;
          } while ((uint)uVar9 < uVar5);
          iVar6 = iVar6 + 1;
        } while (iVar6 != sVar2);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != maxSymbolValue + 1);
    if (uVar5 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x22c,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  uVar9 = 0;
  while( true ) {
    uVar16 = (ulong)dt[uVar9 + 1].baseValue;
    uVar13 = *(ushort *)((long)wksp + uVar16 * 2);
    *(ushort *)((long)wksp + uVar16 * 2) = uVar13 + 1;
    if (uVar13 == 0) {
      __assert_fail("val != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bits.h"
                    ,0xab,"unsigned int ZSTD_highbit32(U32)");
    }
    iVar6 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    bVar8 = bVar7 - (char)iVar6;
    dt[uVar9 + 1].nbBits = bVar8;
    dt[uVar9 + 1].nextState = (uVar13 << (bVar8 & 0x1f)) - (short)uVar15;
    if (nbAdditionalBits[uVar16] == 0xff) break;
    dt[uVar9 + 1].nbAdditionalBits = nbAdditionalBits[uVar16];
    dt[uVar9 + 1].baseValue = baseValue[uVar16];
    uVar9 = uVar9 + 1;
    if (uVar15 == uVar9) {
      return;
    }
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                ,0x237,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

void ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        ZSTD_buildFSETable_body_bmi2(dt, normalizedCounter, maxSymbolValue,
                baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
        return;
    }
#endif
    (void)bmi2;
    ZSTD_buildFSETable_body_default(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}